

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

uint8_t sysbvm_tuple_byteSlotAt(sysbvm_context_t *context,sysbvm_tuple_t tuple,size_t slotIndex)

{
  _Bool _Var1;
  uint8_t uVar2;
  
  _Var1 = sysbvm_tuple_isDummyValue(tuple);
  if (_Var1) {
    sysbvm_error_accessDummyValue();
  }
  if (tuple == 0 || (tuple & 0xf) != 0) {
    if (slotIndex < 8) {
      uVar2 = (uint8_t)((long)tuple >> ((byte)((int)slotIndex << 3) & 0x3f | 4));
    }
    else {
      uVar2 = '\0';
    }
  }
  else {
    _Var1 = sysbvm_tuple_isBytes(tuple);
    if (!_Var1) {
      sysbvm_error("Expected a byte tuple.");
    }
    if (slotIndex < *(uint *)(tuple + 0xc)) {
      uVar2 = *(uint8_t *)(tuple + 0x10 + slotIndex);
    }
    else {
      uVar2 = '\0';
      sysbvm_error_outOfBoundsSlotAccess();
    }
  }
  return uVar2;
}

Assistant:

SYSBVM_API uint8_t sysbvm_tuple_byteSlotAt(sysbvm_context_t *context, sysbvm_tuple_t tuple, size_t slotIndex)
{
    (void)context;
    if(sysbvm_tuple_isDummyValue(tuple)) sysbvm_error_accessDummyValue();

    if(!sysbvm_tuple_isNonNullPointer(tuple))
    {
        if(slotIndex < sizeof(sysbvm_tuple_t))
        {
            sysbvm_tuple_t byteValue = ( ((sysbvm_stuple_t)tuple) >> (SYSBVM_TUPLE_TAG_BIT_COUNT + slotIndex*8)) & 0xFF;
            return (uint8_t)byteValue;
        }

        return 0;
    }

    if(!sysbvm_tuple_isBytes(tuple)) sysbvm_error("Expected a byte tuple.");

    if(slotIndex < sysbvm_tuple_getSizeInBytes(tuple))
        return SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(tuple)->bytes[slotIndex];

    sysbvm_error_outOfBoundsSlotAccess();
    return 0;
}